

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *p,int fUseFanout,int fXorTrick)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Tim_Man_t *pTVar8;
  Gia_Man_t *pGVar9;
  bool bVar10;
  int local_c0;
  int local_bc;
  int local_90;
  int local_8c;
  int iXorLit;
  int iLit2;
  int iLit1;
  int iLit0;
  int iOtherLit;
  int iCiLit;
  Vec_Int_t *vCarries;
  int nRealPos;
  int nRealPis;
  int i;
  int nBoxes;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int fXorTrick_local;
  int fUseFanout_local;
  Gia_Man_t *p_local;
  
  pNew._0_4_ = fXorTrick;
  pNew._4_4_ = fUseFanout;
  _fXorTrick_local = p;
  nRealPis = Gia_ManBoxNum(p);
  _iOtherLit = (Vec_Int_t *)0x0;
  Gia_ManCleanPhase(_fXorTrick_local);
  nRealPos = 0;
  while( true ) {
    iVar2 = nRealPos;
    iVar1 = Vec_IntSize(_fXorTrick_local->vCis);
    bVar10 = false;
    if (iVar2 < iVar1) {
      _i = Gia_ManCi(_fXorTrick_local,nRealPos);
      bVar10 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    if (((*(ulong *)_i >> 0x1e & 1) != 0) || ((*(ulong *)_i >> 0x3e & 1) != 0)) {
      __assert_fail("!pObj->fMark0 && !pObj->fMark1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                    ,0x36c,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
    }
    nRealPos = nRealPos + 1;
  }
  nRealPos = 0;
  while( true ) {
    iVar2 = nRealPos;
    iVar1 = Vec_IntSize(_fXorTrick_local->vCos);
    bVar10 = false;
    if (iVar2 < iVar1) {
      _i = Gia_ManCo(_fXorTrick_local,nRealPos);
      bVar10 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    if (((*(ulong *)_i >> 0x1e & 1) != 0) || ((*(ulong *)_i >> 0x3e & 1) != 0)) {
      __assert_fail("!pObj->fMark0 && !pObj->fMark1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                    ,0x36e,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
    }
    nRealPos = nRealPos + 1;
  }
  nRealPos = 0;
  while( true ) {
    bVar10 = false;
    if (nRealPos < _fXorTrick_local->nObjs) {
      _i = Gia_ManObj(_fXorTrick_local,nRealPos);
      bVar10 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) break;
    iVar2 = Gia_ObjIsAnd(_i);
    if (iVar2 != 0) {
      if (((*(ulong *)_i >> 0x1e & 1) != 0) && ((*(ulong *)_i >> 0x3e & 1) != 0)) {
        __assert_fail("!pObj->fMark0 || !pObj->fMark1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x371,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
      }
      if ((*(ulong *)_i >> 0x1e & 1) != 0) {
        pGVar7 = Gia_ObjFanin0(_i);
        if (*(long *)pGVar7 < 0) {
          __assert_fail("Gia_ObjFanin0(pObj)->fPhase == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                        ,0x374,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)")
          ;
        }
        pGVar7 = Gia_ObjFanin0(_i);
        *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0x7fffffffffffffff | 0x8000000000000000;
      }
      if ((*(ulong *)_i >> 0x3e & 1) != 0) {
        pGVar7 = Gia_ObjFanin1(_i);
        if (*(long *)pGVar7 < 0) {
          __assert_fail("Gia_ObjFanin1(pObj)->fPhase == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                        ,0x379,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)")
          ;
        }
        pGVar7 = Gia_ObjFanin1(_i);
        *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0x7fffffffffffffff | 0x8000000000000000;
      }
    }
    nRealPos = nRealPos + 1;
  }
  if (pNew._4_4_ == 0) {
    iVar2 = Gia_ManObjNum(_fXorTrick_local);
    _iOtherLit = Vec_IntStartFull(iVar2);
  }
  if (_iOtherLit != (Vec_Int_t *)0x0) {
    Gia_ManCreateRefs(_fXorTrick_local);
    nRealPos = 0;
    while( true ) {
      bVar10 = false;
      if (nRealPos < _fXorTrick_local->nObjs) {
        _i = Gia_ManObj(_fXorTrick_local,nRealPos);
        bVar10 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar2 = Gia_ObjIsAnd(_i);
      if (iVar2 != 0) {
        if ((*(ulong *)_i >> 0x1e & 1) == 0) {
          if ((*(ulong *)_i >> 0x3e & 1) != 0) {
            Gia_ObjRefFanin1Dec(_fXorTrick_local,_i);
          }
        }
        else {
          Gia_ObjRefFanin0Dec(_fXorTrick_local,_i);
        }
      }
      nRealPos = nRealPos + 1;
    }
  }
  Gia_ManFillValue(_fXorTrick_local);
  iVar2 = Gia_ManObjNum(_fXorTrick_local);
  pObj = (Gia_Obj_t *)Gia_ManStart(iVar2);
  pcVar6 = Abc_UtilStrsav(_fXorTrick_local->pName);
  *(char **)pObj = pcVar6;
  pcVar6 = Abc_UtilStrsav(_fXorTrick_local->pSpec);
  *(char **)&pObj->Value = pcVar6;
  pGVar7 = Gia_ManConst0(_fXorTrick_local);
  pGVar7->Value = 0;
  nRealPos = 1;
  do {
    bVar10 = false;
    if (nRealPos < _fXorTrick_local->nObjs) {
      _i = Gia_ManObj(_fXorTrick_local,nRealPos);
      bVar10 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar10) {
      Gia_ManCleanPhase(_fXorTrick_local);
      Vec_IntFreeP((Vec_Int_t **)&iOtherLit);
      if (_fXorTrick_local->pRefs != (int *)0x0) {
        free(_fXorTrick_local->pRefs);
        _fXorTrick_local->pRefs = (int *)0x0;
      }
      iVar2 = Gia_ManHasDangling((Gia_Man_t *)pObj);
      if (iVar2 != 0) {
        __assert_fail("!Gia_ManHasDangling(pNew)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x3bc,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
      }
      iVar2 = Gia_ManBoxNum(_fXorTrick_local);
      if (iVar2 == 0) {
        local_bc = Gia_ManCiNum(_fXorTrick_local);
      }
      else {
        local_bc = Tim_ManPiNum((Tim_Man_t *)_fXorTrick_local->pManTime);
      }
      vCarries._4_4_ = local_bc;
      iVar2 = Gia_ManBoxNum(_fXorTrick_local);
      if (iVar2 == 0) {
        local_c0 = Gia_ManCoNum(_fXorTrick_local);
      }
      else {
        local_c0 = Tim_ManPoNum((Tim_Man_t *)_fXorTrick_local->pManTime);
      }
      vCarries._0_4_ = local_c0;
      pTVar8 = Gia_ManGenerateTim(vCarries._4_4_,local_c0,nRealPis,3,2);
      *(Tim_Man_t **)(pObj + 0x32) = pTVar8;
      pGVar9 = Gia_ManGenerateExtraAig(nRealPis,3,2);
      *(Gia_Man_t **)&pObj[0x26].Value = pGVar9;
      return (Gia_Man_t *)pObj;
    }
    iVar2 = Gia_ObjIsCi(_i);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsCo(_i);
      pGVar7 = pObj;
      if (iVar2 == 0) {
        if (((*(ulong *)_i >> 0x1e & 1) == 0) && ((*(ulong *)_i >> 0x3e & 1) == 0)) {
          iVar2 = Gia_ObjFanin0Copy(_i);
          iVar1 = Gia_ObjFanin1Copy(_i);
          uVar3 = Gia_ManAppendAnd((Gia_Man_t *)pGVar7,iVar2,iVar1);
          _i->Value = uVar3;
        }
        else {
          if (((uint)(*(ulong *)_i >> 0x1e) & 1) == ((uint)((ulong)*(undefined8 *)_i >> 0x3e) & 1))
          {
            __assert_fail("pObj->fMark0 != pObj->fMark1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x39b,
                          "Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
          }
          if ((*(ulong *)_i >> 0x1e & 1) == 0) {
            local_8c = Gia_ObjFanin1CopyCarry(_iOtherLit,_i,nRealPos);
          }
          else {
            local_8c = Gia_ObjFanin0CopyCarry(_iOtherLit,_i,nRealPos);
          }
          if ((*(ulong *)_i >> 0x1e & 1) == 0) {
            local_90 = Gia_ObjFanin0Copy(_i);
          }
          else {
            local_90 = Gia_ObjFanin1Copy(_i);
          }
          if ((local_8c < 0) || (local_90 < 0)) {
            __assert_fail("iCiLit >= 0 && iOtherLit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x39e,
                          "Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
          }
          iVar2 = Abc_LitIsCompl(local_8c);
          iVar2 = Abc_LitNotCond(local_8c,iVar2);
          iVar1 = Abc_LitIsCompl(local_8c);
          iVar1 = Abc_LitNotCond(local_90,iVar1);
          iVar4 = Abc_LitIsCompl(local_8c);
          iVar4 = Abc_LitNotCond(0,iVar4);
          iVar5 = Abc_LitIsCompl(iVar2);
          if (iVar5 != 0) {
            __assert_fail("!Abc_LitIsCompl(iLit0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x3a3,
                          "Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
          }
          Gia_ManAppendCo((Gia_Man_t *)pObj,iVar2);
          Gia_ManAppendCo((Gia_Man_t *)pObj,iVar1);
          Gia_ManAppendCo((Gia_Man_t *)pObj,iVar4);
          iVar2 = Gia_ManAppendCi((Gia_Man_t *)pObj);
          iVar1 = Gia_ManAppendCi((Gia_Man_t *)pObj);
          iVar4 = Abc_LitIsCompl(local_8c);
          uVar3 = Abc_LitNotCond(iVar1,iVar4);
          _i->Value = uVar3;
          if ((_iOtherLit != (Vec_Int_t *)0x0) && (*(long *)_i < 0)) {
            Vec_IntWriteEntry(_iOtherLit,nRealPos,_i->Value);
            iVar1 = Gia_ObjRefNum(_fXorTrick_local,_i);
            pGVar7 = pObj;
            if (0 < iVar1) {
              if ((int)pNew == 0) {
                iVar2 = Gia_ObjFanin0Copy(_i);
                iVar1 = Gia_ObjFanin1Copy(_i);
                uVar3 = Gia_ManAppendAnd((Gia_Man_t *)pGVar7,iVar2,iVar1);
                _i->Value = uVar3;
              }
              else {
                iVar1 = Abc_LitIsCompl(local_8c);
                iVar2 = Abc_LitNotCond(iVar2,(uint)((iVar1 != 0 ^ 0xffU) & 1));
                uVar3 = Gia_ManAppendAnd((Gia_Man_t *)pGVar7,iVar2,local_90);
                _i->Value = uVar3;
              }
            }
          }
          nRealPis = nRealPis + 1;
        }
      }
      else {
        iVar2 = Gia_ObjFanin0Copy(_i);
        uVar3 = Gia_ManAppendCo((Gia_Man_t *)pGVar7,iVar2);
        _i->Value = uVar3;
      }
    }
    else {
      uVar3 = Gia_ManAppendCi((Gia_Man_t *)pObj);
      _i->Value = uVar3;
    }
    nRealPos = nRealPos + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxes( Gia_Man_t * p, int fUseFanout, int fXorTrick )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;  
    int nBoxes = Gia_ManBoxNum(p);
    int i, nRealPis, nRealPos;
    Vec_Int_t * vCarries = NULL;
    // make sure two chains do not overlap
    Gia_ManCleanPhase( p );
    Gia_ManForEachCi( p, pObj, i )
        assert( !pObj->fMark0 && !pObj->fMark1 );
    Gia_ManForEachCo( p, pObj, i )
        assert( !pObj->fMark0 && !pObj->fMark1 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        assert( !pObj->fMark0 || !pObj->fMark1 );
        if ( pObj->fMark0 )
        {
            assert( Gia_ObjFanin0(pObj)->fPhase == 0 );
            Gia_ObjFanin0(pObj)->fPhase = 1;
        }
        if ( pObj->fMark1 )
        {
            assert( Gia_ObjFanin1(pObj)->fPhase == 0 );
            Gia_ObjFanin1(pObj)->fPhase = 1;
        }
    }
    // create mapping for carry-chains
    if ( !fUseFanout )
        vCarries = Vec_IntStartFull( Gia_ManObjNum(p) );
    // create references and discount carries
    if ( vCarries )
    {
        Gia_ManCreateRefs( p );
        Gia_ManForEachAnd( p, pObj, i )
            if ( pObj->fMark0 )
                Gia_ObjRefFanin0Dec( p, pObj );
            else if ( pObj->fMark1 )
                Gia_ObjRefFanin1Dec( p, pObj );
    }
    // if AIG already has (natural) FADD boxes, it should not un-normalized
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( !pObj->fMark0 && !pObj->fMark1 ) // AND-gate
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else // AND-gate with chain
        {
            int iCiLit, iOtherLit, iLit0, iLit1, iLit2, iXorLit;
            assert( pObj->fMark0 != pObj->fMark1 );
            iCiLit    = pObj->fMark0 ? Gia_ObjFanin0CopyCarry(vCarries, pObj, i) : Gia_ObjFanin1CopyCarry(vCarries, pObj, i);
            iOtherLit = pObj->fMark0 ? Gia_ObjFanin1Copy(pObj) : Gia_ObjFanin0Copy(pObj);
            assert( iCiLit >= 0 && iOtherLit >= 0 );
            iLit0 = Abc_LitNotCond( iCiLit,    Abc_LitIsCompl(iCiLit) );
            iLit1 = Abc_LitNotCond( iOtherLit, Abc_LitIsCompl(iCiLit) );
            iLit2 = Abc_LitNotCond( 0,         Abc_LitIsCompl(iCiLit) );
            // add COs
            assert( !Abc_LitIsCompl(iLit0) );
            Gia_ManAppendCo( pNew, iLit0 );
            Gia_ManAppendCo( pNew, iLit1 );
            Gia_ManAppendCo( pNew, iLit2 );
            // add CI (unused sum bit)
            iXorLit = Gia_ManAppendCi(pNew);
            // add CI (carry bit)
            pObj->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), Abc_LitIsCompl(iCiLit) );
            if ( vCarries && pObj->fPhase )
            {
                Vec_IntWriteEntry( vCarries, i, pObj->Value );
                if ( Gia_ObjRefNum(p, pObj) > 0 )
                {
                    if ( fXorTrick )
                        pObj->Value = Gia_ManAppendAnd( pNew, Abc_LitNotCond(iXorLit, !Abc_LitIsCompl(iCiLit)), iOtherLit );
                    else
                        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
                }
            }
            nBoxes++;
        }
    }
    Gia_ManCleanPhase( p );
    Vec_IntFreeP( &vCarries );
    ABC_FREE( p->pRefs );
    assert( !Gia_ManHasDangling(pNew) );
    // other information
//    nBoxes += (Gia_ManCiNum(pNew) - Gia_ManCiNum(p)) / 2;
//    assert( nBoxes == Gia_ManBoxNum(p) + (Gia_ManCoNum(pNew) - Gia_ManCoNum(p)) / 3 );
    nRealPis = Gia_ManBoxNum(p) ? Tim_ManPiNum((Tim_Man_t *)p->pManTime) : Gia_ManCiNum(p);
    nRealPos = Gia_ManBoxNum(p) ? Tim_ManPoNum((Tim_Man_t *)p->pManTime) : Gia_ManCoNum(p);
    pNew->pManTime  = Gia_ManGenerateTim( nRealPis, nRealPos, nBoxes, 3, 2 );
    pNew->pAigExtra = Gia_ManGenerateExtraAig( nBoxes, 3, 2 );
    // optionally normalize the AIG
    return pNew;
}